

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::FieldOptions> *pBVar2;
  PointerT<char> pcVar3;
  bool bVar4;
  uint uVar5;
  FieldNameCase FVar6;
  Rep *pRVar7;
  void **ppvVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  char *pcVar10;
  long *plVar11;
  size_t sVar12;
  int array_size;
  undefined1 in_R8B;
  size_t *psVar13;
  void **ppvVar14;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this;
  string_view name;
  string_view input;
  string_view input_00;
  string json_name;
  string lowercase_name;
  string camelcase_name;
  string local_e8;
  long *local_c8;
  undefined8 local_c0;
  long local_b8 [2];
  string local_a8;
  void **local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  undefined8 local_68;
  long *local_60;
  size_type local_58;
  pointer local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined1 local_38 [8];
  
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_001ffdb8:
    PlanAllocationSize((protobuf *)&local_78);
LAB_001ffdc5:
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
               ,0x3906);
  }
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value +
       (fields->super_RepeatedPtrFieldBase).current_size_ * 0x58;
  ppvVar8 = (void **)fields;
  ppvVar14 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    ppvVar14 = pRVar7->elements;
    if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
      ppvVar8 = pRVar7->elements;
    }
  }
  local_88 = ppvVar8 + (fields->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar14 != local_88) {
    do {
      pcVar10 = (char *)*ppvVar14;
      uVar5 = *(uint *)(pcVar10 + 0x10);
      if (((uVar5 & 0x20) != 0) && (*(long *)(pcVar10 + 0x40) == 0)) goto LAB_001ffdc5;
      if ((uVar5 & 0x20) != 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
          pBVar2 = &(alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<google::protobuf::FieldOptions>;
          pBVar2->value = pBVar2->value + 1;
          uVar5 = *(uint *)(pcVar10 + 0x10);
          goto LAB_001ffb4f;
        }
LAB_001ffdab:
        PlanAllocationSize((protobuf *)&local_78);
        goto LAB_001ffdb8;
      }
LAB_001ffb4f:
      psVar13 = (size_t *)(*(ulong *)(pcVar10 + 0x18) & 0xfffffffffffffffc);
      pcVar3 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      local_80 = pcVar10;
      if ((uVar5 & 0x10) == 0) {
        if (pcVar3 != (PointerT<char>)0x0) {
LAB_001ffd9e:
          PlanAllocationSize((protobuf *)&local_78);
          goto LAB_001ffdab;
        }
        sVar12 = *psVar13;
        this = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)psVar13[1];
LAB_001ffba2:
        name._M_str = pcVar10;
        name._M_len = sVar12;
        FVar6 = anon_unknown_23::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::GetFieldNameCase(this,name);
        if (FVar6 == 1) {
          array_size = 3;
        }
        else {
          if (FVar6 != 0) {
            bVar4 = true;
            plVar11 = (long *)0x0;
            goto LAB_001ffbda;
          }
          array_size = 2;
        }
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,array_size);
      }
      else {
        if (pcVar3 != (PointerT<char>)0x0) goto LAB_001ffd9e;
        sVar12 = *psVar13;
        this = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)psVar13[1];
        plVar11 = (long *)(*(ulong *)(pcVar10 + 0x38) & 0xfffffffffffffffc);
        if (plVar11 == (long *)0x0) goto LAB_001ffba2;
        bVar4 = false;
LAB_001ffbda:
        local_c8 = local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,sVar12,
                   (long)&(this->pointers_).payload_.super_Base<char>.value + sVar12);
        absl::lts_20240722::AsciiStrToLower((string *)&local_c8);
        input._M_str = (char *)0x1;
        input._M_len = *psVar13;
        pcVar10 = (char *)0x1;
        (anonymous_namespace)::ToCamelCase_abi_cxx11_
                  (&local_a8,(_anonymous_namespace_ *)psVar13[1],input,(bool)in_R8B);
        if (bVar4) {
          input_00._M_str = pcVar10;
          input_00._M_len = *psVar13;
          (anonymous_namespace)::ToJsonName_abi_cxx11_
                    (&local_e8,(_anonymous_namespace_ *)psVar13[1],input_00);
        }
        else {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*plVar11,plVar11[1] + *plVar11);
        }
        local_70 = *psVar13;
        local_78 = psVar13[1];
        local_68 = local_c0;
        local_60 = local_c8;
        local_58 = local_a8._M_string_length;
        local_50 = local_a8._M_dataplus._M_p;
        local_48 = local_e8._M_string_length;
        local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_e8._M_dataplus._M_p;
        std::
        __insertion_sort<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_78,local_38);
        pbVar9 = std::
                 __unique<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (&local_78,local_38);
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,(int)((ulong)((long)pbVar9 - (long)&local_78) >> 4) + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
        }
      }
      if (((~*(uint *)(local_80 + 0x10) & 0x408) == 0) &&
         ((*(int *)(local_80 + 0x58) == 0xc || (*(int *)(local_80 + 0x58) == 9)))) {
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,1);
      }
      ppvVar14 = ppvVar14 + 1;
    } while (ppvVar14 != local_88);
  }
  return;
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }